

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O3

void google::protobuf::compiler::objectivec::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  _func_void_FieldDescriptor_ptr *p_Var1;
  ObjectiveCType OVar2;
  LogMessage *other;
  mapped_type *pmVar3;
  char *pcVar4;
  string primitive_name;
  undefined1 local_70 [56];
  FieldDescriptor *local_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_70._0_8_ = FieldDescriptor::TypeOnceInit;
    local_38 = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_70,
               &local_38);
  }
  OVar2 = GetObjectiveCType((uint)(byte)descriptor[2]);
  if (OVar2 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)) {
    pcVar4 = *(char **)(&DAT_004d38f8 + (ulong)OVar2 * 8);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_primitive_field.cc"
               ,0x50);
    other = internal::LogMessage::operator<<((LogMessage *)local_70,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    pcVar4 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)local_30,pcVar4,(allocator *)local_70);
  p_Var1 = (_func_void_FieldDescriptor_ptr *)(local_70 + 0x10);
  local_70._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"type","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_70);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((_func_void_FieldDescriptor_ptr *)local_70._0_8_ != p_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  local_70._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"storage_type","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_70);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((_func_void_FieldDescriptor_ptr *)local_70._0_8_ != p_Var1) {
    operator_delete((void *)local_70._0_8_);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           std::map<std::string, std::string>* variables) {
  std::string primitive_name = PrimitiveTypeName(descriptor);
  (*variables)["type"] = primitive_name;
  (*variables)["storage_type"] = primitive_name;
}